

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O2

void __thiscall
dg::vr::VectorSet<llvm::Value_const*>::emplace<llvm::Value_const*&>
          (VectorSet<llvm::Value_const*> *this,Value **vals)

{
  bool bVar1;
  Value *val;
  Value *local_10;
  
  local_10 = *vals;
  bVar1 = contains<llvm::Value_const*>(this,&local_10);
  if (!bVar1) {
    std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
    emplace_back<llvm::Value_const*>
              ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)this,&local_10);
  }
  return;
}

Assistant:

void emplace(S &&...vals) {
        T val(std::forward<S>(vals)...);
        if (!contains(val))
            vec.emplace_back(std::move(val));
    }